

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

VNode * despot::DPOMCP::ConstructTree
                  (vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
                  RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior,History *history,
                  double timeout)

{
  pointer ppSVar1;
  int iVar2;
  int iVar3;
  VNode *vnode;
  log_ostream *plVar4;
  long *plVar5;
  clock_t cVar6;
  undefined4 extraout_var;
  clock_t cVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  ValuedAction VVar11;
  vector<int,_std::allocator<int>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  ValuedAction local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&history->actions_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,&history->observations_);
  (*prior->_vptr_POMCPPrior[5])(prior,&local_70);
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vnode = POMCP::CreateVNode(0,*(particles->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,prior,model);
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar10 = 0;
    do {
      ppSVar1[lVar10]->scenario_id = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
  }
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar4 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar4->super_ostream,
                 "[DPOMCP::ConstructTree] # active particles before search = ",0x3b);
      iVar2 = (*model->_vptr_DSPOMDP[0x18])(model);
      plVar5 = (long *)std::ostream::operator<<(plVar4,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  cVar6 = clock();
  iVar2 = 0;
  do {
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (3 < iVar3) {
        plVar4 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream,"Simulation ",0xb)
        ;
        plVar5 = (long *)std::ostream::operator<<(plVar4,iVar2);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
    }
    iVar3 = Random::NextInt((Random *)&Random::RANDOM,
                            (int)((ulong)((long)(particles->
                                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(particles->
                                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 3));
    iVar3 = (*model->_vptr_DSPOMDP[0x16])
                      (model,(particles->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar3]);
    POMCP::Simulate((State *)CONCAT44(extraout_var,iVar3),streams,vnode,model,prior);
    iVar2 = iVar2 + 1;
    (*model->_vptr_DSPOMDP[0x17])(model,(State *)CONCAT44(extraout_var,iVar3));
    cVar7 = clock();
  } while (((double)cVar7 - (double)cVar6) / 1000000.0 < timeout);
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar4 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar4->super_ostream,"[DPOMCP::ConstructTree] OptimalAction = ",0x28);
      VVar11 = POMCP::OptimalAction(vnode);
      local_40.value = VVar11.value;
      local_40.action = VVar11.action;
      poVar8 = despot::operator<<(&plVar4->super_ostream,&local_40);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      poVar8 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"# Simulations = ",0x10);
      iVar2 = VNode::count(vnode);
      plVar5 = (long *)std::ostream::operator<<(poVar8,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      poVar8 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"# active particles after search = ",0x22);
      iVar2 = (*model->_vptr_DSPOMDP[0x18])(model);
      plVar5 = (long *)std::ostream::operator<<(poVar8,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  return vnode;
}

Assistant:

VNode* DPOMCP::ConstructTree(vector<State*>& particles, RandomStreams& streams,
	const DSPOMDP* model, POMCPPrior* prior, History& history, double timeout) {
	prior->history(history);
	VNode* root = CreateVNode(0, particles[0], prior, model);

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	logi << "[DPOMCP::ConstructTree] # active particles before search = "
		<< model->NumActiveParticles() << endl;
	double start = clock();
	int num_sims = 0;
	while (true) {
		logd << "Simulation " << num_sims << endl;

		int index = Random::RANDOM.NextInt(particles.size());
		State* particle = model->Copy(particles[index]);
		Simulate(particle, streams, root, model, prior);
		num_sims++;
		model->Free(particle);

		if ((clock() - start) / CLOCKS_PER_SEC >= timeout) {
			break;
		}
	}

	logi << "[DPOMCP::ConstructTree] OptimalAction = " << OptimalAction(root)
		<< endl << "# Simulations = " << root->count() << endl
		<< "# active particles after search = " << model->NumActiveParticles()
		<< endl;

	return root;
}